

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uri.h
# Opt level: O2

void __thiscall
Uri::Uri::Uri(Uri *this,string *scheme,string *authority,string *path,string *query,string *fragment
             )

{
  (this->raw)._M_dataplus._M_p = (pointer)&(this->raw).field_2;
  (this->raw)._M_string_length = 0;
  (this->raw).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->scheme,(string *)scheme);
  std::__cxx11::string::string((string *)&this->authority,(string *)authority);
  std::__cxx11::string::string((string *)&this->path,(string *)path);
  std::__cxx11::string::string((string *)&this->query,(string *)query);
  std::__cxx11::string::string((string *)&this->fragment,(string *)fragment);
  return;
}

Assistant:

Uri (string &scheme, string &authority, string &path, string &query, string &fragment)
            : scheme(scheme), authority(authority), path(path), query(query), fragment(fragment) {}